

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

ArrayPtr<const_capnp::_::RawBrandedSchema::Binding> __thiscall
capnp::SchemaLoader::Impl::copyDeduped<capnp::_::RawBrandedSchema::Binding>
          (Impl *this,ArrayPtr<const_capnp::_::RawBrandedSchema::Binding> values)

{
  size_t sVar1;
  Binding *pBVar2;
  Binding *__src;
  ArrayPtr<unsigned_char> local_90;
  ArrayPtr<const_unsigned_char> local_80;
  undefined1 local_70 [8];
  ArrayPtr<capnp::_::RawBrandedSchema::Binding> copy;
  ArrayPtr<const_unsigned_char> *dupe;
  ArrayPtr<const_unsigned_char> *local_50;
  ArrayPtr<const_unsigned_char> *_dupe1770;
  ArrayPtr<const_unsigned_char> bytes;
  Impl *this_local;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Binding> values_local;
  
  values_local.ptr = (Binding *)values.size_;
  this_local = (Impl *)values.ptr;
  sVar1 = kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Binding>::size
                    ((ArrayPtr<const_capnp::_::RawBrandedSchema::Binding> *)&this_local);
  if (sVar1 == 0) {
    bytes.size_ = 0;
    pBVar2 = kj::implicitCast<capnp::_::RawBrandedSchema::Binding_const*,decltype(nullptr)>
                       ((void **)&bytes.size_);
    join_0x00000010_0x00000000_ = kj::arrayPtr<capnp::_::RawBrandedSchema::Binding_const>(pBVar2,0);
  }
  else {
    __dupe1770 = kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Binding>::asBytes
                           ((ArrayPtr<const_capnp::_::RawBrandedSchema::Binding> *)&this_local);
    kj::Table<kj::ArrayPtr<unsigned_char_const>,kj::HashIndex<kj::_::HashSetCallbacks>>::
    find<0ul,kj::ArrayPtr<unsigned_char_const>&>
              ((Table<kj::ArrayPtr<unsigned_char_const>,kj::HashIndex<kj::_::HashSetCallbacks>> *)
               &dupe,(ArrayPtr<const_unsigned_char> *)&this->dedupTable);
    copy.size_ = (size_t)kj::_::readMaybe<kj::ArrayPtr<unsigned_char_const>>
                                   ((Maybe<kj::ArrayPtr<const_unsigned_char>_&> *)&dupe);
    local_50 = (ArrayPtr<const_unsigned_char> *)copy.size_;
    if ((ArrayPtr<const_unsigned_char> *)copy.size_ == (ArrayPtr<const_unsigned_char> *)0x0) {
      sVar1 = kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Binding>::size
                        ((ArrayPtr<const_capnp::_::RawBrandedSchema::Binding> *)&this_local);
      _local_70 = kj::Arena::allocateArray<capnp::_::RawBrandedSchema::Binding>(&this->arena,sVar1);
      pBVar2 = kj::ArrayPtr<capnp::_::RawBrandedSchema::Binding>::begin
                         ((ArrayPtr<capnp::_::RawBrandedSchema::Binding> *)local_70);
      __src = kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Binding>::begin
                        ((ArrayPtr<const_capnp::_::RawBrandedSchema::Binding> *)&this_local);
      sVar1 = kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Binding>::size
                        ((ArrayPtr<const_capnp::_::RawBrandedSchema::Binding> *)&this_local);
      memcpy(pBVar2,__src,sVar1 << 4);
      local_90 = kj::ArrayPtr<capnp::_::RawBrandedSchema::Binding>::asBytes
                           ((ArrayPtr<capnp::_::RawBrandedSchema::Binding> *)local_70);
      local_80 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_90);
      kj::Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>::insert
                (&(this->dedupTable).
                  super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>
                 ,&local_80);
      join_0x00000010_0x00000000_ = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)local_70);
    }
    else {
      pBVar2 = (Binding *)
               kj::ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)copy.size_)
      ;
      sVar1 = kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Binding>::size
                        ((ArrayPtr<const_capnp::_::RawBrandedSchema::Binding> *)&this_local);
      join_0x00000010_0x00000000_ =
           kj::arrayPtr<capnp::_::RawBrandedSchema::Binding_const>(pBVar2,sVar1);
    }
  }
  return stack0xffffffffffffffe8;
}

Assistant:

kj::ArrayPtr<const T> SchemaLoader::Impl::copyDeduped(kj::ArrayPtr<const T> values) {
  if (values.size() == 0) {
    return kj::arrayPtr(kj::implicitCast<const T*>(nullptr), 0);
  }

  auto bytes = values.asBytes();

  KJ_IF_SOME(dupe, dedupTable.find(bytes)) {
    return kj::arrayPtr(reinterpret_cast<const T*>(dupe.begin()), values.size());
  }

  // Need to make a new copy.
  auto copy = arena.allocateArray<T>(values.size());
  memcpy(copy.begin(), values.begin(), values.size() * sizeof(T));

  dedupTable.insert(copy.asBytes());

  return copy;
}